

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Wec_t * Gia_ManCreateNodeSupps(Gia_Man_t *p,Vec_Int_t *vNodes,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int i;
  abctime aVar3;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *vVec2;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *vArr;
  abctime aVar6;
  abctime time;
  uint uVar7;
  
  vVec2 = vNodes;
  aVar3 = Abc_Clock();
  p_00 = Vec_WecStart(vNodes->nSize);
  p_01 = Vec_WecStart(p->nObjs);
  for (uVar7 = 0; (int)uVar7 < p->vCis->nSize; uVar7 = uVar7 + 1) {
    vVec2 = (Vec_Int_t *)Gia_ManCi(p,uVar7);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vVec2);
    if (iVar1 == 0) break;
    pVVar4 = Vec_WecEntry(p_01,iVar1);
    vVec2 = (Vec_Int_t *)(ulong)uVar7;
    Vec_IntPush(pVVar4,uVar7);
  }
  for (uVar7 = 0; (int)uVar7 < p->nObjs; uVar7 = uVar7 + 1) {
    vVec2 = (Vec_Int_t *)(ulong)uVar7;
    pGVar5 = Gia_ManObj(p,uVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(undefined8 *)pGVar5;
    if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
      pVVar4 = Vec_WecEntry(p_01,uVar7 - (uVar2 & 0x1fffffff));
      vVec2 = Vec_WecEntry(p_01,uVar7 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
      vArr = Vec_WecEntry(p_01,uVar7);
      Vec_IntTwoMerge2(pVVar4,vVec2,vArr);
    }
  }
  for (iVar1 = 0; iVar1 < vNodes->nSize; iVar1 = iVar1 + 1) {
    uVar7 = Vec_IntEntry(vNodes,iVar1);
    vVec2 = (Vec_Int_t *)(ulong)uVar7;
    pGVar5 = Gia_ManObj(p,uVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pVVar4 = Vec_WecEntry(p_00,iVar1);
    i = Gia_ObjId(p,pGVar5);
    vVec2 = Vec_WecEntry(p_01,i);
    Vec_IntAppend(pVVar4,vVec2);
  }
  Vec_WecFree(p_01);
  if (fVerbose != 0) {
    aVar6 = Abc_Clock();
    Abc_PrintTime((int)aVar6 - (int)aVar3,(char *)vVec2,time);
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManCreateNodeSupps( Gia_Man_t * p, Vec_Int_t * vNodes, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsNo = Vec_WecStart( Vec_IntSize(vNodes) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsNo, i), Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsNo;
}